

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error-reporter.c++
# Opt level: O2

void __thiscall
capnp::compiler::LineBreakTable::LineBreakTable(LineBreakTable *this,ArrayPtr<const_char> content)

{
  long lVar1;
  char *pcVar2;
  char *pos;
  char *pcVar3;
  long local_38;
  int local_2c;
  
  pcVar3 = content.ptr;
  kj::heapArrayBuilder<unsigned_int>((ArrayBuilder<unsigned_int> *)this,content.size_ / 0x28);
  local_2c = 0;
  kj::Vector<unsigned_int>::add<int>(&this->lineBreaks,&local_2c);
  pcVar2 = pcVar3 + content.size_;
  lVar1 = 1;
  for (; pcVar3 < pcVar2; pcVar3 = pcVar3 + 1) {
    if (*pcVar3 == '\n') {
      local_38 = lVar1;
      kj::Vector<unsigned_int>::add<long>(&this->lineBreaks,&local_38);
    }
    lVar1 = lVar1 + 1;
  }
  return;
}

Assistant:

LineBreakTable::LineBreakTable(kj::ArrayPtr<const char> content)
    : lineBreaks(content.size() / 40) {
  lineBreaks.add(0);
  for (const char* pos = content.begin(); pos < content.end(); ++pos) {
    if (*pos == '\n') {
      lineBreaks.add(pos + 1 - content.begin());
    }
  }
}